

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  byte bVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  AABBNodeMB4D *node1;
  ulong uVar63;
  long lVar64;
  uint uVar65;
  int iVar66;
  ulong uVar67;
  long lVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong *puVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  bool bVar86;
  bool bVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [64];
  float fVar150;
  float fVar151;
  undefined1 auVar147 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar172 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar180 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar190 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar191 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1890 [16];
  long local_1880;
  long local_1878;
  undefined1 (*local_1870) [16];
  ulong local_1868;
  ulong local_1860;
  long local_1858;
  ulong local_1850;
  ulong local_1848;
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  RTCFilterFunctionNArguments local_17f0;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  RTCHitN local_14d0 [16];
  undefined4 local_14c0;
  undefined4 uStack_14bc;
  undefined4 uStack_14b8;
  undefined4 uStack_14b4;
  undefined4 local_14b0;
  undefined4 uStack_14ac;
  undefined4 uStack_14a8;
  undefined4 uStack_14a4;
  undefined4 local_14a0;
  undefined4 uStack_149c;
  undefined4 uStack_1498;
  undefined4 uStack_1494;
  undefined1 local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  uint local_1460;
  uint uStack_145c;
  uint uStack_1458;
  uint uStack_1454;
  uint uStack_1450;
  uint uStack_144c;
  uint uStack_1448;
  uint uStack_1444;
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  undefined4 uStack_1424;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar77 = local_11f8;
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar133 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar136 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar140 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  fVar137 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar141 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar142 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar143 = fVar137 * 0.99999964;
  fVar144 = fVar141 * 0.99999964;
  fVar145 = fVar142 * 0.99999964;
  fVar137 = fVar137 * 1.0000004;
  fVar141 = fVar141 * 1.0000004;
  fVar142 = fVar142 * 1.0000004;
  uVar83 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1848 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar85 = local_1848 ^ 0x20;
  iVar66 = (tray->tnear).field_0.i[k];
  auVar121 = ZEXT3264(CONCAT428(iVar66,CONCAT424(iVar66,CONCAT420(iVar66,CONCAT416(iVar66,CONCAT412(
                                                  iVar66,CONCAT48(iVar66,CONCAT44(iVar66,iVar66)))))
                                                )));
  iVar66 = (tray->tfar).field_0.i[k];
  auVar130 = ZEXT3264(CONCAT428(iVar66,CONCAT424(iVar66,CONCAT420(iVar66,CONCAT416(iVar66,CONCAT412(
                                                  iVar66,CONCAT48(iVar66,CONCAT44(iVar66,iVar66)))))
                                                )));
  local_1420._16_16_ = mm_lookupmask_ps._240_16_;
  local_1420._0_16_ = mm_lookupmask_ps._0_16_;
  local_1870 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar87 = true;
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = 0x3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar103._16_4_ = 0x3f800000;
  auVar103._20_4_ = 0x3f800000;
  auVar103._24_4_ = 0x3f800000;
  auVar103._28_4_ = 0x3f800000;
  auVar90._8_4_ = 0xbf800000;
  auVar90._0_8_ = 0xbf800000bf800000;
  auVar90._12_4_ = 0xbf800000;
  auVar90._16_4_ = 0xbf800000;
  auVar90._20_4_ = 0xbf800000;
  auVar90._24_4_ = 0xbf800000;
  auVar90._28_4_ = 0xbf800000;
  _local_1440 = vblendvps_avx(auVar103,auVar90,local_1420);
  fVar146 = fVar143;
  fVar150 = fVar143;
  fVar151 = fVar143;
  fVar152 = fVar143;
  fVar153 = fVar143;
  fVar154 = fVar143;
  fVar155 = fVar143;
  fVar158 = fVar144;
  fVar159 = fVar144;
  fVar160 = fVar144;
  fVar161 = fVar144;
  fVar162 = fVar144;
  fVar163 = fVar144;
  fVar164 = fVar144;
  fVar165 = fVar145;
  fVar166 = fVar145;
  fVar167 = fVar145;
  fVar168 = fVar145;
  fVar169 = fVar145;
  fVar170 = fVar145;
  fVar171 = fVar145;
  fVar173 = fVar137;
  fVar174 = fVar137;
  fVar175 = fVar137;
  fVar176 = fVar137;
  fVar177 = fVar137;
  fVar178 = fVar137;
  fVar179 = fVar137;
  fVar183 = fVar141;
  fVar184 = fVar141;
  fVar185 = fVar141;
  fVar186 = fVar141;
  fVar187 = fVar141;
  fVar188 = fVar141;
  fVar189 = fVar141;
  fVar192 = fVar142;
  fVar193 = fVar142;
  fVar194 = fVar142;
  fVar195 = fVar142;
  fVar196 = fVar142;
  fVar197 = fVar142;
  fVar198 = fVar142;
  do {
    uVar84 = puVar77[-1];
    puVar77 = puVar77 + -1;
    while( true ) {
      local_16c0 = auVar133._0_32_;
      local_1680 = auVar121._0_32_;
      local_16e0 = auVar136._0_32_;
      local_1700 = auVar140._0_32_;
      local_16a0 = auVar130._0_32_;
      if ((uVar84 & 8) != 0) break;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar91._4_4_ = uVar1;
      auVar91._0_4_ = uVar1;
      auVar91._8_4_ = uVar1;
      auVar91._12_4_ = uVar1;
      auVar91._16_4_ = uVar1;
      auVar91._20_4_ = uVar1;
      auVar91._24_4_ = uVar1;
      auVar91._28_4_ = uVar1;
      uVar63 = uVar84 & 0xfffffffffffffff0;
      auVar88 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar63 + 0x100 + uVar83),auVar91,
                                *(undefined1 (*) [32])(uVar63 + 0x40 + uVar83));
      auVar90 = vsubps_avx(ZEXT1632(auVar88),local_16c0);
      auVar39._4_4_ = fVar146 * auVar90._4_4_;
      auVar39._0_4_ = fVar143 * auVar90._0_4_;
      auVar39._8_4_ = fVar150 * auVar90._8_4_;
      auVar39._12_4_ = fVar151 * auVar90._12_4_;
      auVar39._16_4_ = fVar152 * auVar90._16_4_;
      auVar39._20_4_ = fVar153 * auVar90._20_4_;
      auVar39._24_4_ = fVar154 * auVar90._24_4_;
      auVar39._28_4_ = auVar90._28_4_;
      auVar90 = vmaxps_avx(local_1680,auVar39);
      auVar88 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar63 + 0x100 + local_1848),auVar91,
                                *(undefined1 (*) [32])(uVar63 + 0x40 + local_1848));
      auVar103 = vsubps_avx(ZEXT1632(auVar88),local_16e0);
      auVar40._4_4_ = fVar158 * auVar103._4_4_;
      auVar40._0_4_ = fVar144 * auVar103._0_4_;
      auVar40._8_4_ = fVar159 * auVar103._8_4_;
      auVar40._12_4_ = fVar160 * auVar103._12_4_;
      auVar40._16_4_ = fVar161 * auVar103._16_4_;
      auVar40._20_4_ = fVar162 * auVar103._20_4_;
      auVar40._24_4_ = fVar163 * auVar103._24_4_;
      auVar40._28_4_ = auVar103._28_4_;
      auVar88 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar63 + 0x100 + uVar70),auVar91,
                                *(undefined1 (*) [32])(uVar63 + 0x40 + uVar70));
      auVar103 = vsubps_avx(ZEXT1632(auVar88),local_1700);
      auVar41._4_4_ = fVar165 * auVar103._4_4_;
      auVar41._0_4_ = fVar145 * auVar103._0_4_;
      auVar41._8_4_ = fVar166 * auVar103._8_4_;
      auVar41._12_4_ = fVar167 * auVar103._12_4_;
      auVar41._16_4_ = fVar168 * auVar103._16_4_;
      auVar41._20_4_ = fVar169 * auVar103._20_4_;
      auVar41._24_4_ = fVar170 * auVar103._24_4_;
      auVar41._28_4_ = auVar103._28_4_;
      auVar103 = vmaxps_avx(auVar40,auVar41);
      auVar90 = vmaxps_avx(auVar90,auVar103);
      auVar88 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar63 + 0x100 + (uVar83 ^ 0x20)),auVar91,
                                *(undefined1 (*) [32])(uVar63 + 0x40 + (uVar83 ^ 0x20)));
      auVar103 = vsubps_avx(ZEXT1632(auVar88),local_16c0);
      auVar42._4_4_ = fVar173 * auVar103._4_4_;
      auVar42._0_4_ = fVar137 * auVar103._0_4_;
      auVar42._8_4_ = fVar174 * auVar103._8_4_;
      auVar42._12_4_ = fVar175 * auVar103._12_4_;
      auVar42._16_4_ = fVar176 * auVar103._16_4_;
      auVar42._20_4_ = fVar177 * auVar103._20_4_;
      auVar42._24_4_ = fVar178 * auVar103._24_4_;
      auVar42._28_4_ = auVar103._28_4_;
      auVar103 = vminps_avx(local_16a0,auVar42);
      auVar88 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar63 + 0x100 + uVar85),auVar91,
                                *(undefined1 (*) [32])(uVar63 + 0x40 + uVar85));
      auVar100 = vsubps_avx(ZEXT1632(auVar88),local_16e0);
      auVar88 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar63 + 0x100 + (uVar70 ^ 0x20)),auVar91,
                                *(undefined1 (*) [32])(uVar63 + 0x40 + (uVar70 ^ 0x20)));
      auVar43._4_4_ = fVar183 * auVar100._4_4_;
      auVar43._0_4_ = fVar141 * auVar100._0_4_;
      auVar43._8_4_ = fVar184 * auVar100._8_4_;
      auVar43._12_4_ = fVar185 * auVar100._12_4_;
      auVar43._16_4_ = fVar186 * auVar100._16_4_;
      auVar43._20_4_ = fVar187 * auVar100._20_4_;
      auVar43._24_4_ = fVar188 * auVar100._24_4_;
      auVar43._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(ZEXT1632(auVar88),local_1700);
      auVar44._4_4_ = fVar192 * auVar100._4_4_;
      auVar44._0_4_ = fVar142 * auVar100._0_4_;
      auVar44._8_4_ = fVar193 * auVar100._8_4_;
      auVar44._12_4_ = fVar194 * auVar100._12_4_;
      auVar44._16_4_ = fVar195 * auVar100._16_4_;
      auVar44._20_4_ = fVar196 * auVar100._20_4_;
      auVar44._24_4_ = fVar197 * auVar100._24_4_;
      auVar44._28_4_ = auVar100._28_4_;
      auVar100 = vminps_avx(auVar43,auVar44);
      auVar103 = vminps_avx(auVar103,auVar100);
      auVar90 = vcmpps_avx(auVar90,auVar103,2);
      if (((uint)uVar84 & 7) == 6) {
        auVar103 = vcmpps_avx(*(undefined1 (*) [32])(uVar63 + 0x1c0),auVar91,2);
        auVar100 = vcmpps_avx(auVar91,*(undefined1 (*) [32])(uVar63 + 0x1e0),1);
        auVar103 = vandps_avx(auVar103,auVar100);
        auVar90 = vandps_avx(auVar103,auVar90);
        auVar88 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
      }
      else {
        auVar88 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
      }
      auVar88 = vpsllw_avx(auVar88,0xf);
      if ((((((((auVar88 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar88 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar88 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar88 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar88[0xf])
      goto LAB_005ee71b;
      auVar88 = vpacksswb_avx(auVar88,auVar88);
      bVar38 = SUB161(auVar88 >> 7,0) & 1 | (SUB161(auVar88 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar88 >> 0x17,0) & 1) << 2 | (SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar88 >> 0x27,0) & 1) << 4 | (SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar88 >> 0x37,0) & 1) << 6 | SUB161(auVar88 >> 0x3f,0) << 7;
      lVar69 = 0;
      for (uVar84 = (ulong)bVar38; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        lVar69 = lVar69 + 1;
      }
      uVar84 = *(ulong *)(uVar63 + lVar69 * 8);
      uVar65 = bVar38 - 1 & (uint)bVar38;
      uVar67 = (ulong)uVar65;
      if (uVar65 != 0) {
        *puVar77 = uVar84;
        lVar69 = 0;
        for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
          lVar69 = lVar69 + 1;
        }
        uVar65 = uVar65 - 1 & uVar65;
        uVar67 = (ulong)uVar65;
        bVar86 = uVar65 == 0;
        while( true ) {
          puVar77 = puVar77 + 1;
          uVar84 = *(ulong *)(uVar63 + lVar69 * 8);
          if (bVar86) break;
          *puVar77 = uVar84;
          lVar69 = 0;
          for (uVar84 = uVar67; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
            lVar69 = lVar69 + 1;
          }
          uVar67 = uVar67 - 1 & uVar67;
          bVar86 = uVar67 == 0;
        }
      }
    }
    local_1880 = (ulong)((uint)uVar84 & 0xf) - 8;
    if (local_1880 != 0) {
      uVar84 = uVar84 & 0xfffffffffffffff0;
      local_1878 = 0;
      local_17c0 = fVar142;
      fStack_17bc = fVar192;
      fStack_17b8 = fVar193;
      fStack_17b4 = fVar194;
      fStack_17b0 = fVar195;
      fStack_17ac = fVar196;
      fStack_17a8 = fVar197;
      fStack_17a4 = fVar198;
      local_17a0 = fVar141;
      fStack_179c = fVar183;
      fStack_1798 = fVar184;
      fStack_1794 = fVar185;
      fStack_1790 = fVar186;
      fStack_178c = fVar187;
      fStack_1788 = fVar188;
      fStack_1784 = fVar189;
      local_1780 = fVar137;
      fStack_177c = fVar173;
      fStack_1778 = fVar174;
      fStack_1774 = fVar175;
      fStack_1770 = fVar176;
      fStack_176c = fVar177;
      fStack_1768 = fVar178;
      fStack_1764 = fVar179;
      local_1760 = fVar145;
      fStack_175c = fVar165;
      fStack_1758 = fVar166;
      fStack_1754 = fVar167;
      fStack_1750 = fVar168;
      fStack_174c = fVar169;
      fStack_1748 = fVar170;
      fStack_1744 = fVar171;
      local_1740 = fVar144;
      fStack_173c = fVar158;
      fStack_1738 = fVar159;
      fStack_1734 = fVar160;
      fStack_1730 = fVar161;
      fStack_172c = fVar162;
      fStack_1728 = fVar163;
      fStack_1724 = fVar164;
      local_1720 = fVar143;
      fStack_171c = fVar146;
      fStack_1718 = fVar150;
      fStack_1714 = fVar151;
      fStack_1710 = fVar152;
      fStack_170c = fVar153;
      fStack_1708 = fVar154;
      fStack_1704 = fVar155;
      do {
        lVar64 = local_1878 * 0x60;
        pSVar6 = context->scene;
        pRVar7 = (pSVar6->geometries).items;
        pGVar8 = pRVar7[*(uint *)(uVar84 + 0x40 + lVar64)].ptr;
        fVar137 = (pGVar8->time_range).lower;
        fVar137 = pGVar8->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar137) /
                  ((pGVar8->time_range).upper - fVar137));
        auVar88 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
        auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
        auVar117 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
        iVar66 = (int)auVar117._0_4_;
        lVar79 = (long)iVar66 * 0x38;
        lVar69 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar79);
        uVar78 = (ulong)*(uint *)(uVar84 + 4 + lVar64);
        auVar88 = *(undefined1 (*) [16])(lVar69 + (ulong)*(uint *)(uVar84 + lVar64) * 4);
        uVar67 = (ulong)*(uint *)(uVar84 + 0x10 + lVar64);
        auVar95 = *(undefined1 (*) [16])(lVar69 + uVar67 * 4);
        uVar71 = (ulong)*(uint *)(uVar84 + 0x20 + lVar64);
        auVar102 = *(undefined1 (*) [16])(lVar69 + uVar71 * 4);
        uVar72 = (ulong)*(uint *)(uVar84 + 0x30 + lVar64);
        auVar2 = *(undefined1 (*) [16])(lVar69 + uVar72 * 4);
        local_1858 = *(long *)&pRVar7[*(uint *)(uVar84 + 0x44 + lVar64)].ptr[2].numPrimitives;
        lVar69 = *(long *)(local_1858 + lVar79);
        auVar111 = *(undefined1 (*) [16])(lVar69 + uVar78 * 4);
        uVar73 = (ulong)*(uint *)(uVar84 + 0x14 + lVar64);
        auVar101 = *(undefined1 (*) [16])(lVar69 + uVar73 * 4);
        uVar74 = (ulong)*(uint *)(uVar84 + 0x24 + lVar64);
        auVar3 = *(undefined1 (*) [16])(lVar69 + uVar74 * 4);
        uVar75 = (ulong)*(uint *)(uVar84 + 0x34 + lVar64);
        auVar89 = *(undefined1 (*) [16])(lVar69 + uVar75 * 4);
        lVar69 = *(long *)&pRVar7[*(uint *)(uVar84 + 0x48 + lVar64)].ptr[2].numPrimitives;
        lVar9 = *(long *)(lVar69 + lVar79);
        uVar76 = (ulong)*(uint *)(uVar84 + 8 + lVar64);
        auVar106 = *(undefined1 (*) [16])(lVar9 + uVar76 * 4);
        local_1850 = (ulong)*(uint *)(uVar84 + 0x18 + lVar64);
        auVar190 = *(undefined1 (*) [16])(lVar9 + local_1850 * 4);
        uVar81 = (ulong)*(uint *)(uVar84 + 0x28 + lVar64);
        auVar4 = *(undefined1 (*) [16])(lVar9 + uVar81 * 4);
        uVar82 = (ulong)*(uint *)(uVar84 + 0x38 + lVar64);
        auVar5 = *(undefined1 (*) [16])(lVar9 + uVar82 * 4);
        fVar137 = fVar137 - auVar117._0_4_;
        lVar9 = *(long *)&pRVar7[*(uint *)(uVar84 + 0x4c + lVar64)].ptr[2].numPrimitives;
        lVar79 = *(long *)(lVar9 + lVar79);
        uVar63 = (ulong)*(uint *)(uVar84 + 0xc + lVar64);
        auVar117 = *(undefined1 (*) [16])(lVar79 + uVar63 * 4);
        local_1868 = (ulong)*(uint *)(uVar84 + 0x1c + lVar64);
        auVar131 = *(undefined1 (*) [16])(lVar79 + local_1868 * 4);
        auVar134 = vunpcklps_avx(auVar88,auVar106);
        auVar106 = vunpckhps_avx(auVar88,auVar106);
        auVar138 = vunpcklps_avx(auVar111,auVar117);
        auVar111 = vunpckhps_avx(auVar111,auVar117);
        uVar80 = (ulong)*(uint *)(uVar84 + 0x2c + lVar64);
        auVar88 = *(undefined1 (*) [16])(lVar79 + uVar80 * 4);
        auVar117 = vunpcklps_avx(auVar106,auVar111);
        local_14e0 = vunpcklps_avx(auVar134,auVar138);
        auVar111 = vunpckhps_avx(auVar134,auVar138);
        auVar134 = vunpcklps_avx(auVar95,auVar190);
        auVar106 = vunpckhps_avx(auVar95,auVar190);
        auVar190 = vunpcklps_avx(auVar101,auVar131);
        auVar101 = vunpckhps_avx(auVar101,auVar131);
        local_1860 = (ulong)*(uint *)(uVar84 + 0x3c + lVar64);
        auVar95 = *(undefined1 (*) [16])(lVar79 + local_1860 * 4);
        auVar106 = vunpcklps_avx(auVar106,auVar101);
        auVar131 = vunpcklps_avx(auVar134,auVar190);
        auVar101 = vunpckhps_avx(auVar134,auVar190);
        auVar190 = vunpcklps_avx(auVar102,auVar4);
        auVar102 = vunpckhps_avx(auVar102,auVar4);
        auVar4 = vunpcklps_avx(auVar3,auVar88);
        auVar3 = vunpckhps_avx(auVar3,auVar88);
        lVar68 = (long)(iVar66 + 1) * 0x38;
        lVar79 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar68);
        auVar88 = *(undefined1 (*) [16])(lVar79 + (ulong)*(uint *)(uVar84 + lVar64) * 4);
        auVar134 = vunpcklps_avx(auVar102,auVar3);
        auVar138 = vunpcklps_avx(auVar190,auVar4);
        local_1510 = vunpckhps_avx(auVar190,auVar4);
        auVar3 = vunpcklps_avx(auVar2,auVar5);
        auVar102 = vunpckhps_avx(auVar2,auVar5);
        auVar190 = vunpcklps_avx(auVar89,auVar95);
        auVar2 = vunpckhps_avx(auVar89,auVar95);
        lVar69 = *(long *)(lVar69 + lVar68);
        auVar95 = *(undefined1 (*) [16])(lVar69 + uVar76 * 4);
        auVar4 = vunpcklps_avx(auVar102,auVar2);
        local_14f0 = vunpcklps_avx(auVar3,auVar190);
        local_1500 = vunpckhps_avx(auVar3,auVar190);
        lVar10 = *(long *)(local_1858 + lVar68);
        auVar2 = vunpcklps_avx(auVar88,auVar95);
        auVar102 = vunpckhps_avx(auVar88,auVar95);
        auVar88 = *(undefined1 (*) [16])(lVar10 + uVar78 * 4);
        lVar9 = *(long *)(lVar9 + lVar68);
        auVar95 = *(undefined1 (*) [16])(lVar9 + uVar63 * 4);
        auVar3 = vunpcklps_avx(auVar88,auVar95);
        auVar88 = vunpckhps_avx(auVar88,auVar95);
        auVar190 = vunpcklps_avx(auVar102,auVar88);
        auVar5 = vunpcklps_avx(auVar2,auVar3);
        auVar102 = vunpckhps_avx(auVar2,auVar3);
        auVar88 = *(undefined1 (*) [16])(lVar79 + uVar67 * 4);
        auVar95 = *(undefined1 (*) [16])(lVar69 + local_1850 * 4);
        auVar3 = vunpcklps_avx(auVar88,auVar95);
        auVar2 = vunpckhps_avx(auVar88,auVar95);
        auVar88 = *(undefined1 (*) [16])(lVar10 + uVar73 * 4);
        auVar95 = *(undefined1 (*) [16])(lVar9 + local_1868 * 4);
        auVar89 = vunpcklps_avx(auVar88,auVar95);
        auVar88 = vunpckhps_avx(auVar88,auVar95);
        auVar147 = vunpcklps_avx(auVar2,auVar88);
        auVar35 = vunpcklps_avx(auVar3,auVar89);
        auVar2 = vunpckhps_avx(auVar3,auVar89);
        auVar88 = *(undefined1 (*) [16])(lVar79 + uVar71 * 4);
        auVar95 = *(undefined1 (*) [16])(lVar69 + uVar81 * 4);
        auVar89 = vunpcklps_avx(auVar88,auVar95);
        auVar3 = vunpckhps_avx(auVar88,auVar95);
        auVar88 = *(undefined1 (*) [16])(lVar10 + uVar74 * 4);
        auVar95 = *(undefined1 (*) [16])(lVar9 + uVar80 * 4);
        auVar94 = vunpcklps_avx(auVar88,auVar95);
        auVar88 = vunpckhps_avx(auVar88,auVar95);
        auVar36 = vunpcklps_avx(auVar3,auVar88);
        auVar37 = vunpcklps_avx(auVar89,auVar94);
        auVar3 = vunpckhps_avx(auVar89,auVar94);
        auVar88 = *(undefined1 (*) [16])(lVar79 + uVar72 * 4);
        auVar95 = *(undefined1 (*) [16])(lVar69 + uVar82 * 4);
        auVar94 = vunpcklps_avx(auVar88,auVar95);
        auVar89 = vunpckhps_avx(auVar88,auVar95);
        auVar88 = *(undefined1 (*) [16])(lVar10 + uVar75 * 4);
        auVar95 = *(undefined1 (*) [16])(lVar9 + local_1860 * 4);
        auVar128 = vunpcklps_avx(auVar88,auVar95);
        auVar88 = vunpckhps_avx(auVar88,auVar95);
        auVar95 = vunpcklps_avx(auVar89,auVar88);
        auVar89 = vunpcklps_avx(auVar94,auVar128);
        auVar88 = vunpckhps_avx(auVar94,auVar128);
        fVar141 = 1.0 - fVar137;
        auVar180._4_4_ = fVar141;
        auVar180._0_4_ = fVar141;
        auVar180._8_4_ = fVar141;
        auVar180._12_4_ = fVar141;
        auVar94._0_4_ = fVar137 * auVar5._0_4_;
        auVar94._4_4_ = fVar137 * auVar5._4_4_;
        auVar94._8_4_ = fVar137 * auVar5._8_4_;
        auVar94._12_4_ = fVar137 * auVar5._12_4_;
        auVar5 = vfmadd231ps_fma(auVar94,auVar180,local_14e0);
        auVar128._0_4_ = fVar137 * auVar102._0_4_;
        auVar128._4_4_ = fVar137 * auVar102._4_4_;
        auVar128._8_4_ = fVar137 * auVar102._8_4_;
        auVar128._12_4_ = fVar137 * auVar102._12_4_;
        auVar102 = vfmadd231ps_fma(auVar128,auVar180,auVar111);
        auVar111._0_4_ = auVar190._0_4_ * fVar137;
        auVar111._4_4_ = auVar190._4_4_ * fVar137;
        auVar111._8_4_ = auVar190._8_4_ * fVar137;
        auVar111._12_4_ = auVar190._12_4_ * fVar137;
        auVar111 = vfmadd231ps_fma(auVar111,auVar180,auVar117);
        auVar190._0_4_ = fVar137 * auVar35._0_4_;
        auVar190._4_4_ = fVar137 * auVar35._4_4_;
        auVar190._8_4_ = fVar137 * auVar35._8_4_;
        auVar190._12_4_ = fVar137 * auVar35._12_4_;
        auVar190 = vfmadd231ps_fma(auVar190,auVar180,auVar131);
        auVar117._0_4_ = fVar137 * auVar2._0_4_;
        auVar117._4_4_ = fVar137 * auVar2._4_4_;
        auVar117._8_4_ = fVar137 * auVar2._8_4_;
        auVar117._12_4_ = fVar137 * auVar2._12_4_;
        auVar2 = vfmadd231ps_fma(auVar117,auVar180,auVar101);
        auVar101._0_4_ = auVar147._0_4_ * fVar137;
        auVar101._4_4_ = auVar147._4_4_ * fVar137;
        auVar101._8_4_ = auVar147._8_4_ * fVar137;
        auVar101._12_4_ = auVar147._12_4_ * fVar137;
        auVar101 = vfmadd231ps_fma(auVar101,auVar180,auVar106);
        auVar106._0_4_ = fVar137 * auVar37._0_4_;
        auVar106._4_4_ = fVar137 * auVar37._4_4_;
        auVar106._8_4_ = fVar137 * auVar37._8_4_;
        auVar106._12_4_ = fVar137 * auVar37._12_4_;
        auVar106 = vfmadd231ps_fma(auVar106,auVar180,auVar138);
        auVar138._0_4_ = auVar3._0_4_ * fVar137;
        auVar138._4_4_ = auVar3._4_4_ * fVar137;
        auVar138._8_4_ = auVar3._8_4_ * fVar137;
        auVar138._12_4_ = auVar3._12_4_ * fVar137;
        auVar3 = vfmadd231ps_fma(auVar138,auVar180,local_1510);
        auVar147._0_4_ = auVar36._0_4_ * fVar137;
        auVar147._4_4_ = auVar36._4_4_ * fVar137;
        auVar147._8_4_ = auVar36._8_4_ * fVar137;
        auVar147._12_4_ = auVar36._12_4_ * fVar137;
        auVar117 = vfmadd231ps_fma(auVar147,auVar180,auVar134);
        auVar131._0_4_ = fVar137 * auVar89._0_4_;
        auVar131._4_4_ = fVar137 * auVar89._4_4_;
        auVar131._8_4_ = fVar137 * auVar89._8_4_;
        auVar131._12_4_ = fVar137 * auVar89._12_4_;
        auVar134._0_4_ = auVar88._0_4_ * fVar137;
        auVar134._4_4_ = auVar88._4_4_ * fVar137;
        auVar134._8_4_ = auVar88._8_4_ * fVar137;
        auVar134._12_4_ = auVar88._12_4_ * fVar137;
        lVar69 = uVar84 + 0x40 + lVar64;
        local_13e0 = *(undefined8 *)(lVar69 + 0x10);
        uStack_13d8 = *(undefined8 *)(lVar69 + 0x18);
        auVar89._0_4_ = auVar95._0_4_ * fVar137;
        auVar89._4_4_ = auVar95._4_4_ * fVar137;
        auVar89._8_4_ = auVar95._8_4_ * fVar137;
        auVar89._12_4_ = auVar95._12_4_ * fVar137;
        uStack_13d0 = local_13e0;
        uStack_13c8 = uStack_13d8;
        lVar64 = uVar84 + 0x50 + lVar64;
        local_1400 = *(undefined8 *)(lVar64 + 0x10);
        uStack_13f8 = *(undefined8 *)(lVar64 + 0x18);
        auVar88 = vfmadd231ps_fma(auVar131,auVar180,local_14f0);
        auVar95 = vfmadd231ps_fma(auVar134,auVar180,local_1500);
        auVar89 = vfmadd231ps_fma(auVar89,auVar180,auVar4);
        uStack_13f0 = local_1400;
        uStack_13e8 = uStack_13f8;
        auVar96._16_16_ = auVar106;
        auVar96._0_16_ = auVar5;
        auVar107._16_16_ = auVar3;
        auVar107._0_16_ = auVar102;
        auVar112._16_16_ = auVar117;
        auVar112._0_16_ = auVar111;
        auVar129._16_16_ = auVar190;
        auVar129._0_16_ = auVar190;
        auVar118._16_16_ = auVar2;
        auVar118._0_16_ = auVar2;
        auVar104._16_16_ = auVar101;
        auVar104._0_16_ = auVar101;
        auVar191._16_16_ = auVar88;
        auVar191._0_16_ = auVar88;
        auVar181._16_16_ = auVar95;
        auVar181._0_16_ = auVar95;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar148._4_4_ = uVar1;
        auVar148._0_4_ = uVar1;
        auVar148._8_4_ = uVar1;
        auVar148._12_4_ = uVar1;
        auVar148._16_4_ = uVar1;
        auVar148._20_4_ = uVar1;
        auVar148._24_4_ = uVar1;
        auVar148._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar156._4_4_ = uVar1;
        auVar156._0_4_ = uVar1;
        auVar156._8_4_ = uVar1;
        auVar156._12_4_ = uVar1;
        auVar156._16_4_ = uVar1;
        auVar156._20_4_ = uVar1;
        auVar156._24_4_ = uVar1;
        auVar156._28_4_ = uVar1;
        auVar92._16_16_ = auVar89;
        auVar92._0_16_ = auVar89;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar172._4_4_ = uVar1;
        auVar172._0_4_ = uVar1;
        auVar172._8_4_ = uVar1;
        auVar172._12_4_ = uVar1;
        auVar172._16_4_ = uVar1;
        auVar172._20_4_ = uVar1;
        auVar172._24_4_ = uVar1;
        auVar172._28_4_ = uVar1;
        auVar96 = vsubps_avx(auVar96,auVar148);
        local_1840 = vsubps_avx(auVar107,auVar156);
        local_1540 = vsubps_avx(auVar112,auVar172);
        auVar90 = vsubps_avx(auVar129,auVar148);
        auVar103 = vsubps_avx(auVar118,auVar156);
        auVar100 = vsubps_avx(auVar104,auVar172);
        auVar104 = vsubps_avx(auVar191,auVar148);
        auVar107 = vsubps_avx(auVar181,auVar156);
        auVar33 = vsubps_avx(auVar92,auVar172);
        local_1560 = vsubps_avx(auVar104,auVar96);
        local_15a0 = vsubps_avx(auVar107,local_1840);
        local_1580 = vsubps_avx(auVar33,local_1540);
        auVar93._0_4_ = auVar96._0_4_ + auVar104._0_4_;
        auVar93._4_4_ = auVar96._4_4_ + auVar104._4_4_;
        auVar93._8_4_ = auVar96._8_4_ + auVar104._8_4_;
        auVar93._12_4_ = auVar96._12_4_ + auVar104._12_4_;
        auVar93._16_4_ = auVar96._16_4_ + auVar104._16_4_;
        auVar93._20_4_ = auVar96._20_4_ + auVar104._20_4_;
        auVar93._24_4_ = auVar96._24_4_ + auVar104._24_4_;
        auVar93._28_4_ = auVar96._28_4_ + auVar104._28_4_;
        auVar105._0_4_ = auVar107._0_4_ + local_1840._0_4_;
        auVar105._4_4_ = auVar107._4_4_ + local_1840._4_4_;
        auVar105._8_4_ = auVar107._8_4_ + local_1840._8_4_;
        auVar105._12_4_ = auVar107._12_4_ + local_1840._12_4_;
        auVar105._16_4_ = auVar107._16_4_ + local_1840._16_4_;
        auVar105._20_4_ = auVar107._20_4_ + local_1840._20_4_;
        auVar105._24_4_ = auVar107._24_4_ + local_1840._24_4_;
        fVar137 = local_1840._28_4_;
        auVar105._28_4_ = auVar107._28_4_ + fVar137;
        fVar12 = local_1540._0_4_;
        auVar113._0_4_ = auVar33._0_4_ + fVar12;
        fVar13 = local_1540._4_4_;
        auVar113._4_4_ = auVar33._4_4_ + fVar13;
        fVar14 = local_1540._8_4_;
        auVar113._8_4_ = auVar33._8_4_ + fVar14;
        fVar15 = local_1540._12_4_;
        auVar113._12_4_ = auVar33._12_4_ + fVar15;
        fVar16 = local_1540._16_4_;
        auVar113._16_4_ = auVar33._16_4_ + fVar16;
        fVar17 = local_1540._20_4_;
        auVar113._20_4_ = auVar33._20_4_ + fVar17;
        fVar18 = local_1540._24_4_;
        fVar141 = auVar33._28_4_;
        auVar113._24_4_ = auVar33._24_4_ + fVar18;
        auVar113._28_4_ = fVar141 + local_1540._28_4_;
        auVar34._4_4_ = local_1580._4_4_ * auVar105._4_4_;
        auVar34._0_4_ = local_1580._0_4_ * auVar105._0_4_;
        auVar34._8_4_ = local_1580._8_4_ * auVar105._8_4_;
        auVar34._12_4_ = local_1580._12_4_ * auVar105._12_4_;
        auVar34._16_4_ = local_1580._16_4_ * auVar105._16_4_;
        auVar34._20_4_ = local_1580._20_4_ * auVar105._20_4_;
        auVar34._24_4_ = local_1580._24_4_ * auVar105._24_4_;
        auVar34._28_4_ = uVar1;
        auVar95 = vfmsub231ps_fma(auVar34,local_15a0,auVar113);
        auVar45._4_4_ = local_1560._4_4_ * auVar113._4_4_;
        auVar45._0_4_ = local_1560._0_4_ * auVar113._0_4_;
        auVar45._8_4_ = local_1560._8_4_ * auVar113._8_4_;
        auVar45._12_4_ = local_1560._12_4_ * auVar113._12_4_;
        auVar45._16_4_ = local_1560._16_4_ * auVar113._16_4_;
        auVar45._20_4_ = local_1560._20_4_ * auVar113._20_4_;
        auVar45._24_4_ = local_1560._24_4_ * auVar113._24_4_;
        auVar45._28_4_ = auVar113._28_4_;
        auVar88 = vfmsub231ps_fma(auVar45,local_1580,auVar93);
        auVar46._4_4_ = local_15a0._4_4_ * auVar93._4_4_;
        auVar46._0_4_ = local_15a0._0_4_ * auVar93._0_4_;
        auVar46._8_4_ = local_15a0._8_4_ * auVar93._8_4_;
        auVar46._12_4_ = local_15a0._12_4_ * auVar93._12_4_;
        auVar46._16_4_ = local_15a0._16_4_ * auVar93._16_4_;
        auVar46._20_4_ = local_15a0._20_4_ * auVar93._20_4_;
        auVar46._24_4_ = local_15a0._24_4_ * auVar93._24_4_;
        auVar46._28_4_ = auVar93._28_4_;
        auVar102 = vfmsub231ps_fma(auVar46,local_1560,auVar105);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar157._4_4_ = uVar1;
        auVar157._0_4_ = uVar1;
        auVar157._8_4_ = uVar1;
        auVar157._12_4_ = uVar1;
        auVar157._16_4_ = uVar1;
        auVar157._20_4_ = uVar1;
        auVar157._24_4_ = uVar1;
        auVar157._28_4_ = uVar1;
        fStack_15b0 = *(float *)(ray + k * 4 + 0x60);
        auVar47._4_4_ = fStack_15b0 * auVar102._4_4_;
        auVar47._0_4_ = fStack_15b0 * auVar102._0_4_;
        auVar47._8_4_ = fStack_15b0 * auVar102._8_4_;
        auVar47._12_4_ = fStack_15b0 * auVar102._12_4_;
        auVar47._16_4_ = fStack_15b0 * 0.0;
        auVar47._20_4_ = fStack_15b0 * 0.0;
        auVar47._24_4_ = fStack_15b0 * 0.0;
        auVar47._28_4_ = auVar105._28_4_;
        auVar88 = vfmadd231ps_fma(auVar47,auVar157,ZEXT1632(auVar88));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar182._4_4_ = uVar1;
        auVar182._0_4_ = uVar1;
        auVar182._8_4_ = uVar1;
        auVar182._12_4_ = uVar1;
        auVar182._16_4_ = uVar1;
        auVar182._20_4_ = uVar1;
        auVar182._24_4_ = uVar1;
        auVar182._28_4_ = uVar1;
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar182,ZEXT1632(auVar95));
        local_15e0 = vsubps_avx(local_1840,auVar103);
        local_1620 = vsubps_avx(local_1540,auVar100);
        auVar119._0_4_ = auVar103._0_4_ + local_1840._0_4_;
        auVar119._4_4_ = auVar103._4_4_ + local_1840._4_4_;
        auVar119._8_4_ = auVar103._8_4_ + local_1840._8_4_;
        auVar119._12_4_ = auVar103._12_4_ + local_1840._12_4_;
        auVar119._16_4_ = auVar103._16_4_ + local_1840._16_4_;
        auVar119._20_4_ = auVar103._20_4_ + local_1840._20_4_;
        auVar119._24_4_ = auVar103._24_4_ + local_1840._24_4_;
        auVar119._28_4_ = auVar103._28_4_ + fVar137;
        auVar114._0_4_ = fVar12 + auVar100._0_4_;
        auVar114._4_4_ = fVar13 + auVar100._4_4_;
        auVar114._8_4_ = fVar14 + auVar100._8_4_;
        auVar114._12_4_ = fVar15 + auVar100._12_4_;
        auVar114._16_4_ = fVar16 + auVar100._16_4_;
        auVar114._20_4_ = fVar17 + auVar100._20_4_;
        auVar114._24_4_ = fVar18 + auVar100._24_4_;
        auVar114._28_4_ = local_1540._28_4_ + auVar100._28_4_;
        fVar116 = local_1620._0_4_;
        fVar124 = local_1620._4_4_;
        auVar48._4_4_ = auVar119._4_4_ * fVar124;
        auVar48._0_4_ = auVar119._0_4_ * fVar116;
        fVar127 = local_1620._8_4_;
        auVar48._8_4_ = auVar119._8_4_ * fVar127;
        fVar21 = local_1620._12_4_;
        auVar48._12_4_ = auVar119._12_4_ * fVar21;
        fVar24 = local_1620._16_4_;
        auVar48._16_4_ = auVar119._16_4_ * fVar24;
        fVar27 = local_1620._20_4_;
        auVar48._20_4_ = auVar119._20_4_ * fVar27;
        fVar30 = local_1620._24_4_;
        auVar48._24_4_ = auVar119._24_4_ * fVar30;
        auVar48._28_4_ = fVar137;
        auVar102 = vfmsub231ps_fma(auVar48,local_15e0,auVar114);
        local_1600 = vsubps_avx(auVar96,auVar90);
        fVar122 = local_1600._0_4_;
        fVar125 = local_1600._4_4_;
        auVar49._4_4_ = auVar114._4_4_ * fVar125;
        auVar49._0_4_ = auVar114._0_4_ * fVar122;
        fVar19 = local_1600._8_4_;
        auVar49._8_4_ = auVar114._8_4_ * fVar19;
        fVar22 = local_1600._12_4_;
        auVar49._12_4_ = auVar114._12_4_ * fVar22;
        fVar25 = local_1600._16_4_;
        auVar49._16_4_ = auVar114._16_4_ * fVar25;
        fVar28 = local_1600._20_4_;
        auVar49._20_4_ = auVar114._20_4_ * fVar28;
        fVar31 = local_1600._24_4_;
        auVar49._24_4_ = auVar114._24_4_ * fVar31;
        auVar49._28_4_ = auVar114._28_4_;
        auVar139._0_4_ = auVar96._0_4_ + auVar90._0_4_;
        auVar139._4_4_ = auVar96._4_4_ + auVar90._4_4_;
        auVar139._8_4_ = auVar96._8_4_ + auVar90._8_4_;
        auVar139._12_4_ = auVar96._12_4_ + auVar90._12_4_;
        auVar139._16_4_ = auVar96._16_4_ + auVar90._16_4_;
        auVar139._20_4_ = auVar96._20_4_ + auVar90._20_4_;
        auVar139._24_4_ = auVar96._24_4_ + auVar90._24_4_;
        auVar139._28_4_ = auVar96._28_4_ + auVar90._28_4_;
        auVar95 = vfmsub231ps_fma(auVar49,local_1620,auVar139);
        fVar123 = local_15e0._0_4_;
        fVar126 = local_15e0._4_4_;
        auVar50._4_4_ = auVar139._4_4_ * fVar126;
        auVar50._0_4_ = auVar139._0_4_ * fVar123;
        fVar20 = local_15e0._8_4_;
        auVar50._8_4_ = auVar139._8_4_ * fVar20;
        fVar23 = local_15e0._12_4_;
        auVar50._12_4_ = auVar139._12_4_ * fVar23;
        fVar26 = local_15e0._16_4_;
        auVar50._16_4_ = auVar139._16_4_ * fVar26;
        fVar29 = local_15e0._20_4_;
        auVar50._20_4_ = auVar139._20_4_ * fVar29;
        fVar32 = local_15e0._24_4_;
        auVar50._24_4_ = auVar139._24_4_ * fVar32;
        auVar50._28_4_ = auVar139._28_4_;
        auVar2 = vfmsub231ps_fma(auVar50,local_1600,auVar119);
        auVar51._4_4_ = auVar2._4_4_ * fStack_15b0;
        auVar51._0_4_ = auVar2._0_4_ * fStack_15b0;
        auVar51._8_4_ = auVar2._8_4_ * fStack_15b0;
        auVar51._12_4_ = auVar2._12_4_ * fStack_15b0;
        auVar51._16_4_ = fStack_15b0 * 0.0;
        auVar51._20_4_ = fStack_15b0 * 0.0;
        auVar51._24_4_ = fStack_15b0 * 0.0;
        auVar51._28_4_ = local_1620._28_4_;
        auVar95 = vfmadd231ps_fma(auVar51,auVar157,ZEXT1632(auVar95));
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar182,ZEXT1632(auVar102));
        auVar34 = vsubps_avx(auVar90,auVar104);
        auVar108._0_4_ = auVar90._0_4_ + auVar104._0_4_;
        auVar108._4_4_ = auVar90._4_4_ + auVar104._4_4_;
        auVar108._8_4_ = auVar90._8_4_ + auVar104._8_4_;
        auVar108._12_4_ = auVar90._12_4_ + auVar104._12_4_;
        auVar108._16_4_ = auVar90._16_4_ + auVar104._16_4_;
        auVar108._20_4_ = auVar90._20_4_ + auVar104._20_4_;
        auVar108._24_4_ = auVar90._24_4_ + auVar104._24_4_;
        auVar108._28_4_ = auVar90._28_4_ + auVar104._28_4_;
        auVar104 = vsubps_avx(auVar103,auVar107);
        auVar120._0_4_ = auVar103._0_4_ + auVar107._0_4_;
        auVar120._4_4_ = auVar103._4_4_ + auVar107._4_4_;
        auVar120._8_4_ = auVar103._8_4_ + auVar107._8_4_;
        auVar120._12_4_ = auVar103._12_4_ + auVar107._12_4_;
        auVar120._16_4_ = auVar103._16_4_ + auVar107._16_4_;
        auVar120._20_4_ = auVar103._20_4_ + auVar107._20_4_;
        auVar120._24_4_ = auVar103._24_4_ + auVar107._24_4_;
        auVar120._28_4_ = auVar103._28_4_ + auVar107._28_4_;
        auVar107 = vsubps_avx(auVar100,auVar33);
        auVar97._0_4_ = auVar100._0_4_ + auVar33._0_4_;
        auVar97._4_4_ = auVar100._4_4_ + auVar33._4_4_;
        auVar97._8_4_ = auVar100._8_4_ + auVar33._8_4_;
        auVar97._12_4_ = auVar100._12_4_ + auVar33._12_4_;
        auVar97._16_4_ = auVar100._16_4_ + auVar33._16_4_;
        auVar97._20_4_ = auVar100._20_4_ + auVar33._20_4_;
        auVar97._24_4_ = auVar100._24_4_ + auVar33._24_4_;
        auVar97._28_4_ = auVar100._28_4_ + fVar141;
        auVar100._4_4_ = auVar107._4_4_ * auVar120._4_4_;
        auVar100._0_4_ = auVar107._0_4_ * auVar120._0_4_;
        auVar100._8_4_ = auVar107._8_4_ * auVar120._8_4_;
        auVar100._12_4_ = auVar107._12_4_ * auVar120._12_4_;
        auVar100._16_4_ = auVar107._16_4_ * auVar120._16_4_;
        auVar100._20_4_ = auVar107._20_4_ * auVar120._20_4_;
        auVar100._24_4_ = auVar107._24_4_ * auVar120._24_4_;
        auVar100._28_4_ = fVar141;
        auVar2 = vfmsub231ps_fma(auVar100,auVar104,auVar97);
        auVar33._4_4_ = auVar97._4_4_ * auVar34._4_4_;
        auVar33._0_4_ = auVar97._0_4_ * auVar34._0_4_;
        auVar33._8_4_ = auVar97._8_4_ * auVar34._8_4_;
        auVar33._12_4_ = auVar97._12_4_ * auVar34._12_4_;
        auVar33._16_4_ = auVar97._16_4_ * auVar34._16_4_;
        auVar33._20_4_ = auVar97._20_4_ * auVar34._20_4_;
        auVar33._24_4_ = auVar97._24_4_ * auVar34._24_4_;
        auVar33._28_4_ = auVar97._28_4_;
        auVar102 = vfmsub231ps_fma(auVar33,auVar107,auVar108);
        auVar52._4_4_ = auVar104._4_4_ * auVar108._4_4_;
        auVar52._0_4_ = auVar104._0_4_ * auVar108._0_4_;
        auVar52._8_4_ = auVar104._8_4_ * auVar108._8_4_;
        auVar52._12_4_ = auVar104._12_4_ * auVar108._12_4_;
        auVar52._16_4_ = auVar104._16_4_ * auVar108._16_4_;
        auVar52._20_4_ = auVar104._20_4_ * auVar108._20_4_;
        auVar52._24_4_ = auVar104._24_4_ * auVar108._24_4_;
        auVar52._28_4_ = auVar108._28_4_;
        auVar111 = vfmsub231ps_fma(auVar52,auVar34,auVar120);
        fStack_15bc = fStack_15b0;
        local_15c0 = fStack_15b0;
        fStack_15b8 = fStack_15b0;
        fStack_15b4 = fStack_15b0;
        auVar109._0_4_ = fStack_15b0 * auVar111._0_4_;
        auVar109._4_4_ = fStack_15b0 * auVar111._4_4_;
        auVar109._8_4_ = fStack_15b0 * auVar111._8_4_;
        auVar109._12_4_ = fStack_15b0 * auVar111._12_4_;
        auVar109._16_4_ = fStack_15b0 * 0.0;
        auVar109._20_4_ = fStack_15b0 * 0.0;
        auVar109._24_4_ = fStack_15b0 * 0.0;
        auVar109._28_4_ = 0;
        auVar102 = vfmadd231ps_fma(auVar109,auVar157,ZEXT1632(auVar102));
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar182,ZEXT1632(auVar2));
        local_13c0 = auVar88._0_4_;
        fStack_13bc = auVar88._4_4_;
        fStack_13b8 = auVar88._8_4_;
        fStack_13b4 = auVar88._12_4_;
        local_1380 = ZEXT1632(CONCAT412(auVar102._12_4_ + fStack_13b4 + auVar95._12_4_,
                                        CONCAT48(auVar102._8_4_ + fStack_13b8 + auVar95._8_4_,
                                                 CONCAT44(auVar102._4_4_ +
                                                          fStack_13bc + auVar95._4_4_,
                                                          auVar102._0_4_ +
                                                          local_13c0 + auVar95._0_4_))));
        auVar98._8_4_ = 0x7fffffff;
        auVar98._0_8_ = 0x7fffffff7fffffff;
        auVar98._12_4_ = 0x7fffffff;
        auVar98._16_4_ = 0x7fffffff;
        auVar98._20_4_ = 0x7fffffff;
        auVar98._24_4_ = 0x7fffffff;
        auVar98._28_4_ = 0x7fffffff;
        local_1640 = ZEXT1632(auVar88);
        auVar90 = vminps_avx(local_1640,ZEXT1632(auVar95));
        auVar90 = vminps_avx(auVar90,ZEXT1632(auVar102));
        local_1660 = vandps_avx(local_1380,auVar98);
        fVar137 = local_1660._0_4_ * 1.1920929e-07;
        fVar141 = local_1660._4_4_ * 1.1920929e-07;
        auVar53._4_4_ = fVar141;
        auVar53._0_4_ = fVar137;
        fVar142 = local_1660._8_4_ * 1.1920929e-07;
        auVar53._8_4_ = fVar142;
        fVar143 = local_1660._12_4_ * 1.1920929e-07;
        auVar53._12_4_ = fVar143;
        fVar144 = local_1660._16_4_ * 1.1920929e-07;
        auVar53._16_4_ = fVar144;
        fVar145 = local_1660._20_4_ * 1.1920929e-07;
        auVar53._20_4_ = fVar145;
        fVar146 = local_1660._24_4_ * 1.1920929e-07;
        auVar53._24_4_ = fVar146;
        auVar53._28_4_ = 0x34000000;
        auVar132._0_8_ = CONCAT44(fVar141,fVar137) ^ 0x8000000080000000;
        auVar132._8_4_ = -fVar142;
        auVar132._12_4_ = -fVar143;
        auVar132._16_4_ = -fVar144;
        auVar132._20_4_ = -fVar145;
        auVar132._24_4_ = -fVar146;
        auVar132._28_4_ = 0xb4000000;
        auVar90 = vcmpps_avx(auVar90,auVar132,5);
        auVar100 = vmaxps_avx(local_1640,ZEXT1632(auVar95));
        auVar103 = vmaxps_avx(auVar100,ZEXT1632(auVar102));
        auVar103 = vcmpps_avx(auVar103,auVar53,2);
        auVar103 = vorps_avx(auVar90,auVar103);
        fVar146 = fStack_171c;
        fVar150 = fStack_1718;
        fVar151 = fStack_1714;
        fVar152 = fStack_1710;
        fVar153 = fStack_170c;
        fVar154 = fStack_1708;
        fVar155 = fStack_1704;
        fVar143 = local_1720;
        fVar158 = fStack_173c;
        fVar159 = fStack_1738;
        fVar160 = fStack_1734;
        fVar161 = fStack_1730;
        fVar162 = fStack_172c;
        fVar163 = fStack_1728;
        fVar164 = fStack_1724;
        fVar144 = local_1740;
        fVar165 = fStack_175c;
        fVar166 = fStack_1758;
        fVar167 = fStack_1754;
        fVar168 = fStack_1750;
        fVar169 = fStack_174c;
        fVar170 = fStack_1748;
        fVar171 = fStack_1744;
        fVar145 = local_1760;
        fVar173 = fStack_177c;
        fVar174 = fStack_1778;
        fVar175 = fStack_1774;
        fVar176 = fStack_1770;
        fVar177 = fStack_176c;
        fVar178 = fStack_1768;
        fVar179 = fStack_1764;
        fVar137 = local_1780;
        fVar183 = fStack_179c;
        fVar184 = fStack_1798;
        fVar185 = fStack_1794;
        fVar186 = fStack_1790;
        fVar187 = fStack_178c;
        fVar188 = fStack_1788;
        fVar189 = fStack_1784;
        fVar141 = local_17a0;
        fVar192 = fStack_17bc;
        fVar193 = fStack_17b8;
        fVar194 = fStack_17b4;
        fVar195 = fStack_17b0;
        fVar196 = fStack_17ac;
        fVar197 = fStack_17a8;
        fVar198 = fStack_17a4;
        fVar142 = local_17c0;
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0x7f,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0xbf,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar103[0x1f]) {
LAB_005ee68e:
          auVar133 = ZEXT3264(local_16c0);
          auVar136 = ZEXT3264(local_16e0);
          auVar140 = ZEXT3264(local_1700);
          auVar121 = ZEXT3264(local_1680);
          auVar130 = ZEXT3264(local_16a0);
        }
        else {
          auVar54._4_4_ = fVar126 * local_1580._4_4_;
          auVar54._0_4_ = fVar123 * local_1580._0_4_;
          auVar54._8_4_ = fVar20 * local_1580._8_4_;
          auVar54._12_4_ = fVar23 * local_1580._12_4_;
          auVar54._16_4_ = fVar26 * local_1580._16_4_;
          auVar54._20_4_ = fVar29 * local_1580._20_4_;
          auVar54._24_4_ = fVar32 * local_1580._24_4_;
          auVar54._28_4_ = auVar90._28_4_;
          auVar55._4_4_ = fVar125 * local_15a0._4_4_;
          auVar55._0_4_ = fVar122 * local_15a0._0_4_;
          auVar55._8_4_ = fVar19 * local_15a0._8_4_;
          auVar55._12_4_ = fVar22 * local_15a0._12_4_;
          auVar55._16_4_ = fVar25 * local_15a0._16_4_;
          auVar55._20_4_ = fVar28 * local_15a0._20_4_;
          auVar55._24_4_ = fVar31 * local_15a0._24_4_;
          auVar55._28_4_ = 0x34000000;
          auVar88 = vfmsub213ps_fma(local_15a0,local_1620,auVar54);
          auVar56._4_4_ = auVar104._4_4_ * fVar124;
          auVar56._0_4_ = auVar104._0_4_ * fVar116;
          auVar56._8_4_ = auVar104._8_4_ * fVar127;
          auVar56._12_4_ = auVar104._12_4_ * fVar21;
          auVar56._16_4_ = auVar104._16_4_ * fVar24;
          auVar56._20_4_ = auVar104._20_4_ * fVar27;
          auVar56._24_4_ = auVar104._24_4_ * fVar30;
          auVar56._28_4_ = auVar100._28_4_;
          auVar57._4_4_ = fVar125 * auVar107._4_4_;
          auVar57._0_4_ = fVar122 * auVar107._0_4_;
          auVar57._8_4_ = fVar19 * auVar107._8_4_;
          auVar57._12_4_ = fVar22 * auVar107._12_4_;
          auVar57._16_4_ = fVar25 * auVar107._16_4_;
          auVar57._20_4_ = fVar28 * auVar107._20_4_;
          auVar57._24_4_ = fVar31 * auVar107._24_4_;
          auVar57._28_4_ = local_1660._28_4_;
          auVar102 = vfmsub213ps_fma(auVar107,local_15e0,auVar56);
          auVar90 = vandps_avx(auVar54,auVar98);
          auVar100 = vandps_avx(auVar56,auVar98);
          auVar90 = vcmpps_avx(auVar90,auVar100,1);
          local_1360 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar88),auVar90);
          auVar58._4_4_ = fVar126 * auVar34._4_4_;
          auVar58._0_4_ = fVar123 * auVar34._0_4_;
          auVar58._8_4_ = fVar20 * auVar34._8_4_;
          auVar58._12_4_ = fVar23 * auVar34._12_4_;
          auVar58._16_4_ = fVar26 * auVar34._16_4_;
          auVar58._20_4_ = fVar29 * auVar34._20_4_;
          auVar58._24_4_ = fVar32 * auVar34._24_4_;
          auVar58._28_4_ = auVar90._28_4_;
          auVar88 = vfmsub213ps_fma(auVar34,local_1620,auVar57);
          auVar59._4_4_ = local_1560._4_4_ * fVar124;
          auVar59._0_4_ = local_1560._0_4_ * fVar116;
          auVar59._8_4_ = local_1560._8_4_ * fVar127;
          auVar59._12_4_ = local_1560._12_4_ * fVar21;
          auVar59._16_4_ = local_1560._16_4_ * fVar24;
          auVar59._20_4_ = local_1560._20_4_ * fVar27;
          auVar59._24_4_ = local_1560._24_4_ * fVar30;
          auVar59._28_4_ = auVar100._28_4_;
          auVar102 = vfmsub213ps_fma(local_1580,local_1600,auVar59);
          auVar90 = vandps_avx(auVar59,auVar98);
          auVar100 = vandps_avx(auVar57,auVar98);
          auVar90 = vcmpps_avx(auVar90,auVar100,1);
          local_1340 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar102),auVar90);
          auVar88 = vfmsub213ps_fma(local_1560,local_15e0,auVar55);
          auVar102 = vfmsub213ps_fma(auVar104,local_1600,auVar58);
          auVar90 = vandps_avx(auVar55,auVar98);
          auVar100 = vandps_avx(auVar58,auVar98);
          auVar90 = vcmpps_avx(auVar90,auVar100,1);
          local_1320 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar88),auVar90);
          auVar88 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          fVar116 = local_1320._0_4_;
          auVar99._0_4_ = fVar116 * fStack_15b0;
          fVar122 = local_1320._4_4_;
          auVar99._4_4_ = fVar122 * fStack_15b0;
          fVar123 = local_1320._8_4_;
          auVar99._8_4_ = fVar123 * fStack_15b0;
          fVar124 = local_1320._12_4_;
          auVar99._12_4_ = fVar124 * fStack_15b0;
          fVar125 = local_1320._16_4_;
          auVar99._16_4_ = fVar125 * fStack_15b0;
          fVar126 = local_1320._20_4_;
          auVar99._20_4_ = fVar126 * fStack_15b0;
          fVar127 = local_1320._24_4_;
          auVar99._24_4_ = fVar127 * fStack_15b0;
          auVar99._28_4_ = 0;
          auVar102 = vfmadd213ps_fma(auVar157,local_1340,auVar99);
          auVar102 = vfmadd213ps_fma(auVar182,local_1360,ZEXT1632(auVar102));
          auVar100 = ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                        CONCAT48(auVar102._8_4_ + auVar102._8_4_,
                                                 CONCAT44(auVar102._4_4_ + auVar102._4_4_,
                                                          auVar102._0_4_ + auVar102._0_4_))));
          auVar60._4_4_ = fVar122 * fVar13;
          auVar60._0_4_ = fVar116 * fVar12;
          auVar60._8_4_ = fVar123 * fVar14;
          auVar60._12_4_ = fVar124 * fVar15;
          auVar60._16_4_ = fVar125 * fVar16;
          auVar60._20_4_ = fVar126 * fVar17;
          auVar60._24_4_ = fVar127 * fVar18;
          auVar60._28_4_ = auVar103._28_4_;
          auVar102 = vfmadd213ps_fma(local_1840,local_1340,auVar60);
          auVar2 = vfmadd213ps_fma(auVar96,local_1360,ZEXT1632(auVar102));
          auVar90 = vrcpps_avx(auVar100);
          auVar149._8_4_ = 0x3f800000;
          auVar149._0_8_ = 0x3f8000003f800000;
          auVar149._12_4_ = 0x3f800000;
          auVar149._16_4_ = 0x3f800000;
          auVar149._20_4_ = 0x3f800000;
          auVar149._24_4_ = 0x3f800000;
          auVar149._28_4_ = 0x3f800000;
          auVar102 = vfnmadd213ps_fma(auVar90,auVar100,auVar149);
          auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar90,auVar90);
          local_12a0 = ZEXT1632(CONCAT412(auVar102._12_4_ * (auVar2._12_4_ + auVar2._12_4_),
                                          CONCAT48(auVar102._8_4_ * (auVar2._8_4_ + auVar2._8_4_),
                                                   CONCAT44(auVar102._4_4_ *
                                                            (auVar2._4_4_ + auVar2._4_4_),
                                                            auVar102._0_4_ *
                                                            (auVar2._0_4_ + auVar2._0_4_)))));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar135._4_4_ = uVar1;
          auVar135._0_4_ = uVar1;
          auVar135._8_4_ = uVar1;
          auVar135._12_4_ = uVar1;
          auVar135._16_4_ = uVar1;
          auVar135._20_4_ = uVar1;
          auVar135._24_4_ = uVar1;
          auVar135._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_1820._4_4_ = uVar1;
          local_1820._0_4_ = uVar1;
          local_1820._8_4_ = uVar1;
          local_1820._12_4_ = uVar1;
          local_1820._16_4_ = uVar1;
          local_1820._20_4_ = uVar1;
          local_1820._24_4_ = uVar1;
          local_1820._28_4_ = uVar1;
          auVar90 = vcmpps_avx(auVar135,local_12a0,2);
          auVar103 = vcmpps_avx(local_12a0,local_1820,2);
          auVar90 = vandps_avx(auVar90,auVar103);
          auVar102 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          auVar88 = vpand_avx(auVar102,auVar88);
          auVar90 = vpmovsxwd_avx2(auVar88);
          if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar90 >> 0x7f,0) == '\0') &&
                (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar90 >> 0xbf,0) == '\0') &&
              (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar90[0x1f]) goto LAB_005ee68e;
          auVar90 = vcmpps_avx(auVar100,_DAT_01faff00,4);
          auVar102 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          auVar88 = vpand_avx(auVar88,auVar102);
          local_1300 = vpmovsxwd_avx2(auVar88);
          if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_1300 >> 0x7f,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_1300 >> 0xbf,0) == '\0') &&
              (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_1300[0x1f]) goto LAB_005ee68e;
          uStack_13b0 = 0;
          uStack_13ac = 0;
          uStack_13a8 = 0;
          uStack_13a4 = 0;
          local_13a0 = ZEXT1632(auVar95);
          local_1220 = local_1420;
          auVar90 = vrcpps_avx(local_1380);
          auVar115._8_4_ = 0x3f800000;
          auVar115._0_8_ = 0x3f8000003f800000;
          auVar115._12_4_ = 0x3f800000;
          auVar115._16_4_ = 0x3f800000;
          auVar115._20_4_ = 0x3f800000;
          auVar115._24_4_ = 0x3f800000;
          auVar115._28_4_ = 0x3f800000;
          auVar102 = vfnmadd213ps_fma(local_1380,auVar90,auVar115);
          auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar90,auVar90);
          auVar110._8_4_ = 0x219392ef;
          auVar110._0_8_ = 0x219392ef219392ef;
          auVar110._12_4_ = 0x219392ef;
          auVar110._16_4_ = 0x219392ef;
          auVar110._20_4_ = 0x219392ef;
          auVar110._24_4_ = 0x219392ef;
          auVar110._28_4_ = 0x219392ef;
          auVar90 = vcmpps_avx(local_1660,auVar110,5);
          auVar90 = vandps_avx(auVar90,ZEXT1632(auVar102));
          auVar61._4_4_ = fStack_13bc * auVar90._4_4_;
          auVar61._0_4_ = local_13c0 * auVar90._0_4_;
          auVar61._8_4_ = fStack_13b8 * auVar90._8_4_;
          auVar61._12_4_ = fStack_13b4 * auVar90._12_4_;
          auVar61._16_4_ = auVar90._16_4_ * 0.0;
          auVar61._20_4_ = auVar90._20_4_ * 0.0;
          auVar61._24_4_ = auVar90._24_4_ * 0.0;
          auVar61._28_4_ = 0;
          auVar103 = vminps_avx(auVar61,auVar115);
          auVar62._4_4_ = auVar95._4_4_ * auVar90._4_4_;
          auVar62._0_4_ = auVar95._0_4_ * auVar90._0_4_;
          auVar62._8_4_ = auVar95._8_4_ * auVar90._8_4_;
          auVar62._12_4_ = auVar95._12_4_ * auVar90._12_4_;
          auVar62._16_4_ = auVar90._16_4_ * 0.0;
          auVar62._20_4_ = auVar90._20_4_ * 0.0;
          auVar62._24_4_ = auVar90._24_4_ * 0.0;
          auVar62._28_4_ = local_1620._28_4_;
          auVar90 = vminps_avx(auVar62,auVar115);
          auVar100 = vsubps_avx(auVar115,auVar103);
          auVar96 = vsubps_avx(auVar115,auVar90);
          local_12c0 = vblendvps_avx(auVar90,auVar100,local_1420);
          local_12e0 = vblendvps_avx(auVar103,auVar96,local_1420);
          local_1260._4_4_ = (float)local_1440._4_4_ * local_1340._4_4_;
          local_1260._0_4_ = (float)local_1440._0_4_ * local_1340._0_4_;
          local_1260._8_4_ = fStack_1438 * local_1340._8_4_;
          local_1260._12_4_ = fStack_1434 * local_1340._12_4_;
          local_1260._16_4_ = fStack_1430 * local_1340._16_4_;
          local_1260._20_4_ = fStack_142c * local_1340._20_4_;
          local_1260._24_4_ = fStack_1428 * local_1340._24_4_;
          local_1260._28_4_ = local_12c0._28_4_;
          local_1240._4_4_ = (float)local_1440._4_4_ * fVar122;
          local_1240._0_4_ = (float)local_1440._0_4_ * fVar116;
          local_1240._8_4_ = fStack_1438 * fVar123;
          local_1240._12_4_ = fStack_1434 * fVar124;
          local_1240._16_4_ = fStack_1430 * fVar125;
          local_1240._20_4_ = fStack_142c * fVar126;
          local_1240._24_4_ = fStack_1428 * fVar127;
          local_1240._28_4_ = uStack_1424;
          local_1280[0] = local_1360._0_4_ * (float)local_1440._0_4_;
          local_1280[1] = local_1360._4_4_ * (float)local_1440._4_4_;
          local_1280[2] = local_1360._8_4_ * fStack_1438;
          local_1280[3] = local_1360._12_4_ * fStack_1434;
          fStack_1270 = local_1360._16_4_ * fStack_1430;
          fStack_126c = local_1360._20_4_ * fStack_142c;
          fStack_1268 = local_1360._24_4_ * fStack_1428;
          uStack_1264 = local_12e0._28_4_;
          auVar88 = vpacksswb_avx(auVar88,auVar88);
          uVar63 = (ulong)(byte)(SUB161(auVar88 >> 7,0) & 1 | (SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar88 >> 0x3f,0) << 7);
          auVar133 = ZEXT3264(local_16c0);
          auVar136 = ZEXT3264(local_16e0);
          auVar140 = ZEXT3264(local_1700);
          auVar121 = ZEXT3264(local_1680);
          auVar130 = ZEXT3264(local_16a0);
          fStack_15ac = fStack_15b0;
          fStack_15a8 = fStack_15b0;
          fStack_15a4 = fStack_15b0;
          do {
            uVar67 = 0;
            for (uVar71 = uVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
              uVar67 = uVar67 + 1;
            }
            uVar65 = *(uint *)((long)&local_13e0 + uVar67 * 4);
            pGVar8 = (pSVar6->geometries).items[uVar65].ptr;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar63 = uVar63 ^ 1L << (uVar67 & 0x3f);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005ee731:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar87;
              }
              local_1840._0_8_ = uVar63;
              uVar63 = (ulong)(uint)((int)uVar67 * 4);
              local_14a0 = *(undefined4 *)(local_12e0 + uVar63);
              uVar1 = *(undefined4 *)(local_12c0 + uVar63);
              local_1490._4_4_ = uVar1;
              local_1490._0_4_ = uVar1;
              local_1490._8_4_ = uVar1;
              local_1490._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar63);
              local_17f0.context = context->user;
              local_1470._4_4_ = uVar65;
              local_1470._0_4_ = uVar65;
              local_1470._8_4_ = uVar65;
              local_1470._12_4_ = uVar65;
              uVar1 = *(undefined4 *)((long)&local_1400 + uVar63);
              local_1480._4_4_ = uVar1;
              local_1480._0_4_ = uVar1;
              local_1480._8_4_ = uVar1;
              local_1480._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_1280 + uVar63);
              local_14d0._4_4_ = uVar1;
              local_14d0._0_4_ = uVar1;
              local_14d0._8_4_ = uVar1;
              local_14d0._12_4_ = uVar1;
              local_14c0 = *(undefined4 *)(local_1260 + uVar63);
              local_14b0 = *(undefined4 *)(local_1240 + uVar63);
              vpcmpeqd_avx2(ZEXT1632(local_1470),ZEXT1632(local_1470));
              uStack_145c = (local_17f0.context)->instID[0];
              local_1460 = uStack_145c;
              uStack_1458 = uStack_145c;
              uStack_1454 = uStack_145c;
              uStack_1450 = (local_17f0.context)->instPrimID[0];
              uStack_144c = uStack_1450;
              uStack_1448 = uStack_1450;
              uStack_1444 = uStack_1450;
              local_1890 = *local_1870;
              local_17f0.valid = (int *)local_1890;
              local_17f0.geometryUserPtr = pGVar8->userPtr;
              local_17f0.hit = local_14d0;
              local_17f0.N = 4;
              local_17f0.ray = (RTCRayN *)ray;
              uStack_14bc = local_14c0;
              uStack_14b8 = local_14c0;
              uStack_14b4 = local_14c0;
              uStack_14ac = local_14b0;
              uStack_14a8 = local_14b0;
              uStack_14a4 = local_14b0;
              uStack_149c = local_14a0;
              uStack_1498 = local_14a0;
              uStack_1494 = local_14a0;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->occlusionFilterN)(&local_17f0);
                auVar140 = ZEXT3264(local_1700);
                auVar136 = ZEXT3264(local_16e0);
                auVar133 = ZEXT3264(local_16c0);
                fVar143 = local_1720;
                fVar146 = fStack_171c;
                fVar150 = fStack_1718;
                fVar151 = fStack_1714;
                fVar152 = fStack_1710;
                fVar153 = fStack_170c;
                fVar154 = fStack_1708;
                fVar155 = fStack_1704;
                fVar144 = local_1740;
                fVar158 = fStack_173c;
                fVar159 = fStack_1738;
                fVar160 = fStack_1734;
                fVar161 = fStack_1730;
                fVar162 = fStack_172c;
                fVar163 = fStack_1728;
                fVar164 = fStack_1724;
                fVar145 = local_1760;
                fVar165 = fStack_175c;
                fVar166 = fStack_1758;
                fVar167 = fStack_1754;
                fVar168 = fStack_1750;
                fVar169 = fStack_174c;
                fVar170 = fStack_1748;
                fVar171 = fStack_1744;
                fVar137 = local_1780;
                fVar173 = fStack_177c;
                fVar174 = fStack_1778;
                fVar175 = fStack_1774;
                fVar176 = fStack_1770;
                fVar177 = fStack_176c;
                fVar178 = fStack_1768;
                fVar179 = fStack_1764;
                fVar141 = local_17a0;
                fVar183 = fStack_179c;
                fVar184 = fStack_1798;
                fVar185 = fStack_1794;
                fVar186 = fStack_1790;
                fVar187 = fStack_178c;
                fVar188 = fStack_1788;
                fVar189 = fStack_1784;
                fVar142 = local_17c0;
                fVar192 = fStack_17bc;
                fVar193 = fStack_17b8;
                fVar194 = fStack_17b4;
                fVar195 = fStack_17b0;
                fVar196 = fStack_17ac;
                fVar197 = fStack_17a8;
                fVar198 = fStack_17a4;
              }
              if (local_1890 == (undefined1  [16])0x0) {
                auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar88 = auVar88 ^ _DAT_01f7ae20;
              }
              else {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var11)(&local_17f0);
                  auVar140 = ZEXT3264(local_1700);
                  auVar136 = ZEXT3264(local_16e0);
                  auVar133 = ZEXT3264(local_16c0);
                  fVar143 = local_1720;
                  fVar146 = fStack_171c;
                  fVar150 = fStack_1718;
                  fVar151 = fStack_1714;
                  fVar152 = fStack_1710;
                  fVar153 = fStack_170c;
                  fVar154 = fStack_1708;
                  fVar155 = fStack_1704;
                  fVar144 = local_1740;
                  fVar158 = fStack_173c;
                  fVar159 = fStack_1738;
                  fVar160 = fStack_1734;
                  fVar161 = fStack_1730;
                  fVar162 = fStack_172c;
                  fVar163 = fStack_1728;
                  fVar164 = fStack_1724;
                  fVar145 = local_1760;
                  fVar165 = fStack_175c;
                  fVar166 = fStack_1758;
                  fVar167 = fStack_1754;
                  fVar168 = fStack_1750;
                  fVar169 = fStack_174c;
                  fVar170 = fStack_1748;
                  fVar171 = fStack_1744;
                  fVar137 = local_1780;
                  fVar173 = fStack_177c;
                  fVar174 = fStack_1778;
                  fVar175 = fStack_1774;
                  fVar176 = fStack_1770;
                  fVar177 = fStack_176c;
                  fVar178 = fStack_1768;
                  fVar179 = fStack_1764;
                  fVar141 = local_17a0;
                  fVar183 = fStack_179c;
                  fVar184 = fStack_1798;
                  fVar185 = fStack_1794;
                  fVar186 = fStack_1790;
                  fVar187 = fStack_178c;
                  fVar188 = fStack_1788;
                  fVar189 = fStack_1784;
                  fVar142 = local_17c0;
                  fVar192 = fStack_17bc;
                  fVar193 = fStack_17b8;
                  fVar194 = fStack_17b4;
                  fVar195 = fStack_17b0;
                  fVar196 = fStack_17ac;
                  fVar197 = fStack_17a8;
                  fVar198 = fStack_17a4;
                }
                auVar95 = vpcmpeqd_avx(local_1890,_DAT_01f7aa10);
                auVar88 = auVar95 ^ _DAT_01f7ae20;
                auVar102._8_4_ = 0xff800000;
                auVar102._0_8_ = 0xff800000ff800000;
                auVar102._12_4_ = 0xff800000;
                auVar95 = vblendvps_avx(auVar102,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                        auVar95);
                *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar95;
              }
              auVar121 = ZEXT3264(local_1680);
              auVar130 = ZEXT3264(local_16a0);
              auVar95._8_8_ = 0x100000001;
              auVar95._0_8_ = 0x100000001;
              if ((auVar95 & auVar88) != (undefined1  [16])0x0) goto LAB_005ee731;
              *(int *)(ray + k * 4 + 0x80) = local_1820._0_4_;
              uVar63 = local_1840._0_8_ ^ 1L << (uVar67 & 0x3f);
            }
          } while (uVar63 != 0);
        }
        local_1878 = local_1878 + 1;
      } while (local_1878 != local_1880);
    }
LAB_005ee71b:
    bVar87 = puVar77 != &local_1200;
    if (!bVar87) {
      return bVar87;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }